

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_get_ecpubkey(uchar **p,uchar *end,mbedtls_ecp_keypair *key)

{
  int local_24;
  int ret;
  mbedtls_ecp_keypair *key_local;
  uchar *end_local;
  uchar **p_local;
  
  local_24 = mbedtls_ecp_point_read_binary(&key->grp,&key->Q,*p,(long)end - (long)*p);
  if (local_24 == 0) {
    local_24 = mbedtls_ecp_check_pubkey(&key->grp,&key->Q);
  }
  *p = end;
  return local_24;
}

Assistant:

static int pk_get_ecpubkey( unsigned char **p, const unsigned char *end,
                            mbedtls_ecp_keypair *key )
{
    int ret;

    if( ( ret = mbedtls_ecp_point_read_binary( &key->grp, &key->Q,
                    (const unsigned char *) *p, end - *p ) ) == 0 )
    {
        ret = mbedtls_ecp_check_pubkey( &key->grp, &key->Q );
    }

    /*
     * We know mbedtls_ecp_point_read_binary consumed all bytes or failed
     */
    *p = (unsigned char *) end;

    return( ret );
}